

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_uwsgi_module.c
# Opt level: O0

char * ngx_http_uwsgi_store(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  int iVar1;
  ngx_int_t nVar2;
  undefined1 local_90 [8];
  ngx_http_script_compile_t sc;
  ngx_str_t *value;
  ngx_http_uwsgi_loc_conf_t *uwcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  if ((char)(*(char *)((long)conf + 0x1a0) << 4) >> 6 == -1) {
    sc._80_8_ = cf->args->elts;
    iVar1 = strcmp(*(char **)(sc._80_8_ + 0x18),"off");
    if (iVar1 == 0) {
      *(byte *)((long)conf + 0x1a0) = *(byte *)((long)conf + 0x1a0) & 0xf3;
      cf_local = (ngx_conf_t *)0x0;
    }
    else if ((char)(*(char *)((long)conf + 0x1a0) << 6) >> 6 < '\x01') {
      *(byte *)((long)conf + 0x1a0) = *(byte *)((long)conf + 0x1a0) & 0xf3 | 4;
      iVar1 = strcmp(*(char **)(sc._80_8_ + 0x18),"on");
      if (iVar1 == 0) {
        cf_local = (ngx_conf_t *)0x0;
      }
      else {
        *(long *)(sc._80_8_ + 0x10) = *(long *)(sc._80_8_ + 0x10) + 1;
        memset(local_90,0,0x58);
        sc.cf = (ngx_conf_t *)(sc._80_8_ + 0x10);
        sc.flushes = (ngx_array_t **)((long)conf + 400);
        sc.lengths = (ngx_array_t **)((long)conf + 0x198);
        local_90 = (undefined1  [8])cf;
        sc.values = (ngx_array_t **)ngx_http_script_variables_count((ngx_str_t *)(sc._80_8_ + 0x10))
        ;
        sc.main._0_1_ = (byte)sc.main & 0xf9 | 6;
        nVar2 = ngx_http_script_compile((ngx_http_script_compile_t *)local_90);
        if (nVar2 == 0) {
          cf_local = (ngx_conf_t *)0x0;
        }
        else {
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
      }
    }
    else {
      cf_local = (ngx_conf_t *)anon_var_dwarf_ee656;
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_uwsgi_store(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_uwsgi_loc_conf_t *uwcf = conf;

    ngx_str_t                  *value;
    ngx_http_script_compile_t   sc;

    if (uwcf->upstream.store != NGX_CONF_UNSET) {
        return "is duplicate";
    }

    value = cf->args->elts;

    if (ngx_strcmp(value[1].data, "off") == 0) {
        uwcf->upstream.store = 0;
        return NGX_CONF_OK;
    }

#if (NGX_HTTP_CACHE)

    if (uwcf->upstream.cache > 0) {
        return "is incompatible with \"uwsgi_cache\"";
    }

#endif

    uwcf->upstream.store = 1;

    if (ngx_strcmp(value[1].data, "on") == 0) {
        return NGX_CONF_OK;
    }

    /* include the terminating '\0' into script */
    value[1].len++;

    ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

    sc.cf = cf;
    sc.source = &value[1];
    sc.lengths = &uwcf->upstream.store_lengths;
    sc.values = &uwcf->upstream.store_values;
    sc.variables = ngx_http_script_variables_count(&value[1]);
    sc.complete_lengths = 1;
    sc.complete_values = 1;

    if (ngx_http_script_compile(&sc) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}